

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c
# Opt level: O0

ch_string * ch_table_find_string(ch_table *table,char *value,size_t size)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  ch_table_entry *pcVar5;
  _Bool result;
  _Bool b;
  _Bool a;
  ch_table_entry *entry;
  uint32_t index;
  uint32_t hash;
  size_t size_local;
  char *value_local;
  ch_table *table_local;
  
  if (table->size == 0) {
    return (ch_string *)0x0;
  }
  uVar3 = ch_hash_string(value,size);
  entry._0_4_ = uVar3 & table->capacity - 1;
  do {
    pcVar5 = table->entries + (uint)entry;
    if (pcVar5->key == (ch_string *)0x0) {
      if ((pcVar5->value).type == PRIMITIVE_NULL) {
        return (ch_string *)0x0;
      }
    }
    else {
      uVar1 = pcVar5->key->size;
      uVar2 = pcVar5->key->hash;
      iVar4 = memcmp(pcVar5->key->value,value,size);
      if (((uVar1 == size) && (uVar2 == uVar3)) && (iVar4 == 0)) {
        return pcVar5->key;
      }
    }
    entry._0_4_ = (uint)entry + 1 & table->capacity - 1;
  } while( true );
}

Assistant:

ch_string *ch_table_find_string(ch_table *table, const char *value,
                                size_t size) {
  if (table->size == 0)
    return NULL;

  uint32_t hash = ch_hash_string(value, size);
  uint32_t index = hash & (table->capacity - 1);
  for (;;) {
    ch_table_entry *entry = &table->entries[index];
    if (entry->key == NULL) {

      if (IS_NULL(entry->value))
        return NULL;
    } else  {
    // } else if (entry->key->size == size && entry->key->hash == hash &&
    //            memcmp(entry->key->value, value, size) == 0) {
      bool a = entry->key->size == size;
      bool b = entry->key->hash == hash;
      bool result = memcmp(entry->key->value, value, size) == 0;
      if (a && b && result) {
        return entry->key;
      }

    }

    index = (index + 1) & (table->capacity - 1);
  }
}